

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O3

void __thiscall psy::C::ParserTester::case0244(ParserTester *this)

{
  string text;
  Expectation X;
  ParseOptions parseOpts;
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  undefined8 in_stack_fffffffffffffdf8;
  pointer in_stack_fffffffffffffe00;
  pointer in_stack_fffffffffffffe08;
  pointer in_stack_fffffffffffffe10;
  undefined1 *puVar2;
  undefined8 in_stack_fffffffffffffe20;
  long in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 in_stack_fffffffffffffe40;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe58 [64];
  _Alloc_hider in_stack_fffffffffffffe98;
  size_type in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeb0 [16];
  pointer in_stack_fffffffffffffec0;
  pointer in_stack_fffffffffffffec8;
  pointer local_130;
  vector<psy::C::Decl,_std::allocator<psy::C::Decl>_> local_128;
  pointer local_108;
  pointer local_f8;
  Expectation local_f0;
  SyntaxKind local_38 [20];
  
  puVar2 = &stack0xfffffffffffffe28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe18,"void ( * x ( double ) ) ( int ) { }","");
  Expectation::Expectation((Expectation *)&stack0xfffffffffffffe58);
  local_38[8] = ParameterSuffix;
  local_38[9] = ParameterDeclaration;
  local_38[10] = BasicTypeSpecifier;
  local_38[0xb] = AbstractDeclarator;
  local_38[0xc] = ParameterSuffix;
  local_38[0xd] = ParameterDeclaration;
  local_38[0xe] = BasicTypeSpecifier;
  local_38[0xf] = AbstractDeclarator;
  local_38[0] = STARTof_Node;
  local_38[1] = FunctionDefinition;
  local_38[2] = VoidTypeSpecifier;
  local_38[3] = FunctionDeclarator;
  local_38[4] = ParenthesizedDeclarator;
  local_38[5] = PointerDeclarator;
  local_38[6] = FunctionDeclarator;
  local_38[7] = IdentifierDeclarator;
  local_38[0x10] = 0x469;
  __l._M_len = 0x11;
  __l._M_array = local_38;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffe00,__l,(allocator_type *)&stack0xfffffffffffffdff);
  pEVar1 = Expectation::AST((Expectation *)&stack0xfffffffffffffe58,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &stack0xfffffffffffffe00);
  Expectation::Expectation(&local_f0,pEVar1);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xfffffffffffffe38);
  text._M_string_length = in_stack_fffffffffffffe40.BF_all_;
  text._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe38;
  text.field_2._M_allocated_capacity = in_stack_fffffffffffffe48.BF_all_;
  text.field_2._8_8_ = in_stack_fffffffffffffe50;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe00;
  X.numE_ = (int)in_stack_fffffffffffffdf8;
  X.numW_ = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe08;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe10;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar2;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe20;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe28;
  X.continueTestDespiteOfErrors_ = (bool)(char)in_stack_fffffffffffffe30;
  X.containsAmbiguity_ = (bool)(char)((ulong)in_stack_fffffffffffffe30 >> 8);
  X._58_6_ = (int6)((ulong)in_stack_fffffffffffffe30 >> 0x10);
  X.ambiguityText_._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe38;
  X.ambiguityText_._M_string_length = in_stack_fffffffffffffe40.BF_all_;
  X.ambiguityText_.field_2._M_allocated_capacity = in_stack_fffffffffffffe48.BF_all_;
  X.ambiguityText_.field_2._8_8_ = in_stack_fffffffffffffe50;
  X.unfinishedParse_ = (bool)in_stack_fffffffffffffe58[0];
  X._97_7_ = in_stack_fffffffffffffe58._1_7_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data =
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       in_stack_fffffffffffffe58._8_24_;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)in_stack_fffffffffffffe58._32_24_;
  X.checkScope_ = (bool)in_stack_fffffffffffffe58[0x38];
  X._153_7_ = in_stack_fffffffffffffe58._57_7_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffffe98._M_p;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffea0;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffea8;
  parseOpts.langExts_.field_1 =
       (anon_union_8_2_2d0bec1f_for_LanguageExtensions_1)in_stack_fffffffffffffec0;
  parseOpts.langDialect_.std_ = in_stack_fffffffffffffeb0[0];
  parseOpts._1_7_ = in_stack_fffffffffffffeb0._1_7_;
  parseOpts.langExts_.translations_.field_0 =
       (anon_union_8_2_2d0bec1f_for_MacroTranslations_0)in_stack_fffffffffffffeb0._8_8_;
  parseOpts._24_8_ = in_stack_fffffffffffffec8;
  parse(this,text,X,(SyntaxCategory)&stack0xfffffffffffffe18,parseOpts);
  if (local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_f0.declarations_);
  if (local_f0.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.ambiguityText_._M_dataplus._M_p != &local_f0.ambiguityText_.field_2) {
    operator_delete(local_f0.ambiguityText_._M_dataplus._M_p,
                    local_f0.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0.descriptorsE_);
  if (in_stack_fffffffffffffe00 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffe00,
                    (long)in_stack_fffffffffffffe10 - (long)in_stack_fffffffffffffe00);
  }
  if (local_108 != (pointer)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_128);
  if (in_stack_fffffffffffffec0 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffec0,(long)local_130 - (long)in_stack_fffffffffffffec0);
  }
  if (in_stack_fffffffffffffe98._M_p != &stack0xfffffffffffffea8) {
    operator_delete(in_stack_fffffffffffffe98._M_p,in_stack_fffffffffffffea8 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe60);
  if (puVar2 != &stack0xfffffffffffffe28) {
    operator_delete(puVar2,in_stack_fffffffffffffe28 + 1);
  }
  return;
}

Assistant:

void ParserTester::case0244()
{
    // A function taking a parameter of type double and returning
    // a pointer to a function taking int as a parameter and
    // returning void.

    parse("void ( * x ( double ) ) ( int ) { }",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::FunctionDefinition,
                              SyntaxKind::VoidTypeSpecifier,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::ParenthesizedDeclarator,
                              SyntaxKind::PointerDeclarator,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::AbstractDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::AbstractDeclarator,
                              SyntaxKind::CompoundStatement }));
}